

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TestHarness_cTest.cpp
# Opt level: O0

void __thiscall
TEST_TestHarness_c_checkUnsignedLongLongInt_Test::~TEST_TestHarness_c_checkUnsignedLongLongInt_Test
          (TEST_TestHarness_c_checkUnsignedLongLongInt_Test *this)

{
  TEST_TestHarness_c_checkUnsignedLongLongInt_Test *this_local;
  
  ~TEST_TestHarness_c_checkUnsignedLongLongInt_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(TestHarness_c, checkUnsignedLongLongInt)
{
    CHECK_EQUAL_C_ULONGLONG(2, 2);
    fixture->setTestFunction(failUnsignedLongLongIntMethod_);
    fixture->runAllTests();
    fixture->assertPrintContains("expected <1 (0x1)>\n\tbut was  <2 (0x2)>");
    fixture->assertPrintContains("arness_c");
    CHECK(!hasDestructorOfTheDestructorCheckedBeenCalled);
}